

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::option_exists_error::option_exists_error(option_exists_error *this,string *option)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"Option ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::LQUOTE_abi_cxx11_);
  std::operator+(&bStack_98,&local_38,option);
  std::operator+(&local_78,&bStack_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::RQUOTE_abi_cxx11_);
  std::operator+(&local_58,&local_78," already exists");
  OptionSpecException::OptionSpecException(&this->super_OptionSpecException,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&(this->super_OptionSpecException).super_OptionException =
       &PTR__OptionException_00138340;
  return;
}

Assistant:

option_exists_error(const std::string& option)
    : OptionSpecException("Option " + LQUOTE + option + RQUOTE + " already exists")
    {
    }